

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::reallocateTo
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  pointer pEVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pEVar7;
  long lVar8;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  pEVar7 = (pointer)operator_new(newCapacity << 5);
  pEVar2 = this->data_;
  sVar3 = this->len;
  for (lVar8 = 0; sVar3 << 5 != lVar8; lVar8 = lVar8 + 0x20) {
    ctx = (EVP_PKEY_CTX *)((long)&(pEVar2->symbol).ptr + lVar8);
    puVar1 = (undefined8 *)((long)&(pEVar7->symbol).ptr + lVar8);
    uVar4 = *(undefined8 *)ctx;
    uVar5 = *(undefined8 *)(ctx + 8);
    uVar6 = *(undefined8 *)(ctx + 0x18);
    puVar1[2] = *(undefined8 *)(ctx + 0x10);
    puVar1[3] = uVar6;
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = pEVar7;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }